

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseStringLiteral(char *in,char *end,Value **stringData)

{
  byte *pbVar1;
  long lVar2;
  Value *pVVar3;
  byte *pbVar4;
  long lVar5;
  size_t len;
  
  *stringData = (Value *)0x0;
  pbVar4 = (byte *)in;
  if (in != end && in != (char *)0x0) {
    do {
      in = (char *)pbVar4;
      if ((0x2c < (ulong)(byte)*in) || ((0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0))
      break;
      pbVar4 = (byte *)in + 1;
      in = end;
    } while (pbVar4 != (byte *)end);
    if (*in == 0x22) {
      pbVar4 = (byte *)in + 1;
      len = 0;
      if ((pbVar4 != (byte *)end) && (((byte *)in)[1] != 0x22)) {
        lVar2 = 2;
        lVar5 = 0;
        do {
          lVar5 = lVar5 + -1;
          if ((byte *)in + lVar2 == (byte *)end) break;
          pbVar1 = (byte *)in + lVar2;
          lVar2 = lVar2 + 1;
        } while (*pbVar1 != 0x22);
        in = (char *)((byte *)in + -lVar5);
        len = -lVar5;
      }
      pVVar3 = ValueAllocator::allocPrimData(ddl_string,len);
      *stringData = pVVar3;
      strncpy((char *)pVVar3->m_data,(char *)pbVar4,len);
      (*stringData)->m_data[len] = '\0';
      in = (char *)((byte *)in + 2);
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseStringLiteral( char *in, char *end, Value **stringData ) {
    *stringData = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    size_t len( 0 );
    char *start( in );
    if( *start == '\"' ) {
        ++start;
        ++in;
        while( *in != '\"' && in != end ) {
            ++in;
            ++len;
        }

        *stringData = ValueAllocator::allocPrimData( Value::ddl_string, len );
        ::strncpy( ( char* ) ( *stringData )->m_data, start, len );
        ( *stringData )->m_data[len] = '\0';
        ++in;
    }

    return in;
}